

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::save_load(cb_adf *c,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  ostream *poVar2;
  stringstream *msg_00;
  ostream *poVar3;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  stringstream msg;
  undefined8 in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe48;
  undefined1 read_00;
  version_struct *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  io_buf *in_stack_fffffffffffffe68;
  ostream local_190;
  byte local_12;
  byte local_11;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  bVar1 = version_struct::operator<(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
    poVar2 = std::operator<<(&local_190,"event_sum ");
    msg_00 = (stringstream *)std::ostream::operator<<(poVar2,*(ulong *)(local_8 + 0x18));
    read_00 = (undefined1)((ulong)poVar2 >> 0x38);
    std::operator<<((ostream *)msg_00,"\n");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50,(bool)read_00,msg_00,
               SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
    poVar2 = std::operator<<(&local_190,"action_sum ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(local_8 + 0x10));
    std::operator<<(poVar3,"\n");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50,(bool)read_00,msg_00,SUB81((ulong)poVar2 >> 0x38,0)
              );
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  }
  return;
}

Assistant:

void save_load(cb_adf& c, io_buf& model_file, bool read, bool text)
{
  if (c.all->model_file_ver < VERSION_FILE_WITH_CB_ADF_SAVE)
    return;
  stringstream msg;
  msg << "event_sum " << c.gen_cs.event_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.event_sum, sizeof(c.gen_cs.event_sum), "", read, msg, text);

  msg << "action_sum " << c.gen_cs.action_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.action_sum, sizeof(c.gen_cs.action_sum), "", read, msg, text);
}